

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcProve.c
# Opt level: O2

int Abc_NtkMiterProve(Abc_Ntk_t **ppNtk,void *pPars)

{
  int iVar1;
  long *plVar2;
  DdNode *pDVar3;
  uint uVar4;
  abctime aVar5;
  long lVar6;
  Abc_Ntk_t *pAVar7;
  Fraig_Man_t *p;
  Abc_Ntk_t *pAVar8;
  int *piVar9;
  int *__dest;
  DdNode *pDVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  ABC_INT64_T AVar16;
  int iVar17;
  double dVar18;
  double dVar19;
  ABC_INT64_T nSatInspects;
  ABC_INT64_T nSatConfs;
  Abc_Ntk_t **local_88;
  double local_80;
  ulong local_78;
  Fraig_Params_t local_70;
  
  pAVar8 = *ppNtk;
  if (pAVar8->ntkType != ABC_NTK_STRASH) {
    pcVar11 = "Abc_NtkIsStrash(pNtk)";
    uVar4 = 0x48;
LAB_002abea5:
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcProve.c"
                  ,uVar4,"int Abc_NtkMiterProve(Abc_Ntk_t **, void *)");
  }
  if (pAVar8->vPos->nSize != 1) {
    pcVar11 = "Abc_NtkPoNum(pNtk) == 1";
    uVar4 = 0x49;
    goto LAB_002abea5;
  }
  if (*(int *)((long)pPars + 0xc) != 0) {
    pcVar11 = "yes";
    pcVar12 = "yes";
    if (*(int *)((long)pPars + 4) == 0) {
      pcVar12 = "no";
    }
    if (*pPars == 0) {
      pcVar11 = "no";
    }
    printf("RESOURCE LIMITS: Iterations = %d. Rewriting = %s. Fraiging = %s.\n",
           (ulong)*(uint *)((long)pPars + 0x10),pcVar12,pcVar11);
    printf("Miter = %d (%3.1f).  Rwr = %d (%3.1f).  Fraig = %d (%3.1f).  Last = %d.\n",
           (double)*(float *)((long)pPars + 0x18),(double)*(float *)((long)pPars + 0x20),
           (double)*(float *)((long)pPars + 0x28),(ulong)*(uint *)((long)pPars + 0x14),
           (ulong)*(uint *)((long)pPars + 0x1c));
  }
  local_88 = ppNtk;
  if ((*(int *)((long)pPars + 4) == 0) && (*pPars == 0)) {
    aVar5 = Abc_Clock();
    uVar4 = Abc_NtkMiterSat(pAVar8,(long)*(int *)((long)pPars + 0x34),0,0,(ABC_INT64_T *)0x0,
                            (ABC_INT64_T *)0x0);
    Abc_NtkMiterPrint(pAVar8,"SAT solving",aVar5,*(int *)((long)pPars + 0xc));
    goto LAB_002abdc1;
  }
  uVar4 = 0xffffffff;
  uVar15 = 0;
  while (iVar17 = (int)uVar15, iVar17 < *(int *)((long)pPars + 0x10)) {
    dVar19 = (double)iVar17;
    if (*(int *)((long)pPars + 0xc) != 0) {
      iVar1 = *(int *)((long)pPars + 0x14);
      dVar18 = pow((double)*(float *)((long)pPars + 0x18),dVar19);
      pow((double)*(float *)((long)pPars + 0x28),dVar19);
      printf("ITERATION %2d : Confs = %6d. FraigBTL = %3d. \n",(ulong)(iVar17 + 1),
             (ulong)(uint)(int)(dVar18 * (double)iVar1));
      fflush(_stdout);
    }
    local_78 = uVar15;
    aVar5 = Abc_Clock();
    if (*(long *)((long)pPars + 0x40) == 0) {
      AVar16 = 0;
    }
    else {
      AVar16 = *(long *)((long)pPars + 0x40) - *(long *)((long)pPars + 0x50);
    }
    iVar17 = *(int *)((long)pPars + 0x14);
    dVar18 = pow((double)*(float *)((long)pPars + 0x18),dVar19);
    uVar4 = Abc_NtkMiterSat(pAVar8,(long)(dVar18 * (double)iVar17),AVar16,0,&nSatConfs,&nSatInspects
                           );
    Abc_NtkMiterPrint(pAVar8,"SAT solving",aVar5,*(int *)((long)pPars + 0xc));
    if (-1 < (int)uVar4) goto LAB_002abc83;
    lVar13 = *(long *)((long)pPars + 0x48) + nSatConfs;
    *(long *)((long)pPars + 0x48) = lVar13;
    lVar6 = *(long *)((long)pPars + 0x50) + nSatInspects;
    *(long *)((long)pPars + 0x50) = lVar6;
    if ((*(long *)((long)pPars + 0x38) <= lVar13 && *(long *)((long)pPars + 0x38) != 0) ||
       (*(long *)((long)pPars + 0x40) <= lVar6 && *(long *)((long)pPars + 0x40) != 0)) {
      puts("Reached global limit on conflicts/inspects. Quitting.");
      uVar4 = 0xffffffff;
      goto LAB_002abdc1;
    }
    pAVar7 = pAVar8;
    if (*(int *)((long)pPars + 4) != 0) {
      aVar5 = Abc_Clock();
      iVar17 = *(int *)((long)pPars + 0x1c);
      dVar18 = pow((double)*(float *)((long)pPars + 0x20),dVar19);
      iVar17 = -(int)(dVar18 * (double)iVar17);
      while( true ) {
        iVar17 = iVar17 + 3;
        Abc_NtkRewrite(pAVar8,0,0,0,0,0);
        uVar4 = Abc_NtkMiterIsConstant(pAVar8);
        pAVar7 = pAVar8;
        if ((-1 < (int)uVar4) || (iVar17 == 2)) break;
        Abc_NtkRefactor(pAVar8,10,0x10,0,0,0,0);
        uVar4 = Abc_NtkMiterIsConstant(pAVar8);
        if ((-1 < (int)uVar4) || (iVar17 == 1)) break;
        pAVar7 = Abc_NtkBalance(pAVar8,0,0,0);
        Abc_NtkDelete(pAVar8);
        uVar4 = Abc_NtkMiterIsConstant(pAVar7);
        if ((-1 < (int)uVar4) || (pAVar8 = pAVar7, iVar17 == 0)) break;
      }
      Abc_NtkMiterPrint(pAVar7,"Rewriting  ",aVar5,*(int *)((long)pPars + 0xc));
    }
    pAVar8 = pAVar7;
    if (*pPars != 0) {
      aVar5 = Abc_Clock();
      if (*(long *)((long)pPars + 0x40) == 0) {
        lVar6 = 0;
      }
      else {
        lVar6 = *(long *)((long)pPars + 0x40) - *(long *)((long)pPars + 0x50);
      }
      local_80 = (double)*(int *)((long)pPars + 0x24);
      dVar19 = pow((double)*(float *)((long)pPars + 0x28),dVar19);
      dVar19 = dVar19 * local_80;
      iVar17 = (int)(0x8000000 / (long)(pAVar7->vCis->nSize + pAVar7->nObjCounts[7]));
      if (0x1f < iVar17) {
        iVar17 = 0x20;
      }
      Fraig_ParamsSetDefault(&local_70);
      local_70.nPatsRand = iVar17 << 5;
      local_70.nSeconds = -1;
      local_70.fTryProve = 0;
      local_70.fVerbose = 0;
      local_70.fDoSparse = 1;
      local_70.nPatsDyna = local_70.nPatsRand;
      local_70.nBTLimit = (int)dVar19;
      local_70.nInspLimit = lVar6;
      p = (Fraig_Man_t *)Abc_NtkToFraig(pAVar7,&local_70,0,0);
      Fraig_ManProveMiter(p);
      uVar4 = Fraig_ManCheckMiter(p);
      pAVar8 = Abc_NtkFromFraig(p,pAVar7);
      if (uVar4 == 0) {
        piVar9 = Fraig_ManReadModel(p);
        free(pAVar8->pModel);
        sVar14 = (long)pAVar8->vCis->nSize << 2;
        __dest = (int *)malloc(sVar14);
        pAVar8->pModel = __dest;
        memcpy(__dest,piVar9,sVar14);
      }
      Fraig_ManReadSatFails(p);
      iVar17 = Fraig_ManReadConflicts(p);
      nSatConfs = (ABC_INT64_T)iVar17;
      iVar17 = Fraig_ManReadInspects(p);
      nSatInspects = (ABC_INT64_T)iVar17;
      Fraig_ManFree(p);
      Abc_NtkDelete(pAVar7);
      Abc_NtkMiterPrint(pAVar8,"FRAIGing   ",aVar5,*(int *)((long)pPars + 0xc));
      if (-1 < (int)uVar4) goto LAB_002abc83;
      lVar13 = *(long *)((long)pPars + 0x48) + nSatConfs;
      *(long *)((long)pPars + 0x48) = lVar13;
      lVar6 = *(long *)((long)pPars + 0x50) + nSatInspects;
      *(long *)((long)pPars + 0x50) = lVar6;
      if ((*(long *)((long)pPars + 0x38) <= lVar13 && *(long *)((long)pPars + 0x38) != 0) ||
         (*(long *)((long)pPars + 0x40) <= lVar6 && *(long *)((long)pPars + 0x40) != 0)) {
        puts("Reached global limit on conflicts/inspects. Quitting.");
        uVar4 = 0xffffffff;
        goto LAB_002abdc1;
      }
    }
    uVar15 = (ulong)((int)local_78 + 1);
  }
  if ((int)uVar4 < 0) {
    iVar17 = *(int *)((long)pPars + 0xc);
    if (*(int *)((long)pPars + 8) != 0) {
      if (iVar17 != 0) {
        printf("Attempting BDDs with node limit %d ...\n",(ulong)*(uint *)((long)pPars + 0x2c));
        fflush(_stdout);
      }
      aVar5 = Abc_Clock();
      pAVar7 = Abc_NtkCollapse(pAVar8,*(int *)((long)pPars + 0x2c),0,*(int *)((long)pPars + 0x30),0,
                               0,0);
      if (pAVar7 != (Abc_Ntk_t *)0x0) {
        Abc_NtkDelete(pAVar8);
        pAVar8 = pAVar7;
        if (pAVar7->nObjCounts[7] == 1) {
          if (pAVar7->vPos->nSize < 1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          plVar2 = (long *)*pAVar7->vPos->pArray;
          pDVar3 = *(DdNode **)
                    (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                              (long)*(int *)plVar2[4] * 8) + 0x38);
          pDVar10 = Cudd_ReadLogicZero((DdManager *)pAVar7->pManFunc);
          uVar4 = (uint)(pDVar3 == pDVar10);
        }
        else {
          uVar4 = 0;
        }
      }
      Abc_NtkMiterPrint(pAVar8,"BDD building",aVar5,*(int *)((long)pPars + 0xc));
      if (-1 < (int)uVar4) goto LAB_002abc83;
      iVar17 = *(int *)((long)pPars + 0xc);
    }
    if (iVar17 != 0) {
      printf("Attempting SAT with conflict limit %d ...\n",(ulong)*(uint *)((long)pPars + 0x34));
      fflush(_stdout);
    }
    aVar5 = Abc_Clock();
    if (*(long *)((long)pPars + 0x40) == 0) {
      AVar16 = 0;
    }
    else {
      AVar16 = *(long *)((long)pPars + 0x40) - *(long *)((long)pPars + 0x50);
    }
    uVar4 = Abc_NtkMiterSat(pAVar8,(long)*(int *)((long)pPars + 0x34),AVar16,0,(ABC_INT64_T *)0x0,
                            (ABC_INT64_T *)0x0);
    Abc_NtkMiterPrint(pAVar8,"SAT solving",aVar5,*(int *)((long)pPars + 0xc));
  }
LAB_002abc83:
  if ((uVar4 == 0) && (pAVar8->pModel == (int *)0x0)) {
    sVar14 = (long)pAVar8->vCis->nSize << 2;
    piVar9 = (int *)malloc(sVar14);
    pAVar8->pModel = piVar9;
    memset(piVar9,0,sVar14);
  }
LAB_002abdc1:
  *local_88 = pAVar8;
  return uVar4;
}

Assistant:

int Abc_NtkMiterProve( Abc_Ntk_t ** ppNtk, void * pPars )
{
    Prove_Params_t * pParams = (Prove_Params_t *)pPars;
    Abc_Ntk_t * pNtk, * pNtkTemp;
    int RetValue = -1, nIter, nSatFails, Counter;
    abctime clk; //, timeStart = Abc_Clock();
    ABC_INT64_T nSatConfs, nSatInspects, nInspectLimit;

    // get the starting network
    pNtk = *ppNtk;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkPoNum(pNtk) == 1 );
 
    if ( pParams->fVerbose )
    {
        printf( "RESOURCE LIMITS: Iterations = %d. Rewriting = %s. Fraiging = %s.\n",
            pParams->nItersMax, pParams->fUseRewriting? "yes":"no", pParams->fUseFraiging? "yes":"no" );
        printf( "Miter = %d (%3.1f).  Rwr = %d (%3.1f).  Fraig = %d (%3.1f).  Last = %d.\n", 
            pParams->nMiteringLimitStart,  pParams->nMiteringLimitMulti, 
            pParams->nRewritingLimitStart, pParams->nRewritingLimitMulti,
            pParams->nFraigingLimitStart,  pParams->nFraigingLimitMulti, pParams->nMiteringLimitLast );
    }

    // if SAT only, solve without iteration
    if ( !pParams->fUseRewriting && !pParams->fUseFraiging )
    {
        clk = Abc_Clock();
        RetValue = Abc_NtkMiterSat( pNtk, (ABC_INT64_T)pParams->nMiteringLimitLast, (ABC_INT64_T)0, 0, NULL, NULL );
        Abc_NtkMiterPrint( pNtk, "SAT solving", clk, pParams->fVerbose );
        *ppNtk = pNtk;
        return RetValue;
    }

    // check the current resource limits
    for ( nIter = 0; nIter < pParams->nItersMax; nIter++ )
    {
        if ( pParams->fVerbose )
        {
            printf( "ITERATION %2d : Confs = %6d. FraigBTL = %3d. \n", nIter+1, 
                 (int)(pParams->nMiteringLimitStart * pow(pParams->nMiteringLimitMulti,nIter)), 
                 (int)(pParams->nFraigingLimitStart * pow(pParams->nFraigingLimitMulti,nIter)) );
            fflush( stdout );
        }

        // try brute-force SAT
        clk = Abc_Clock();
        nInspectLimit = pParams->nTotalInspectLimit? pParams->nTotalInspectLimit - pParams->nTotalInspectsMade : 0;
        RetValue = Abc_NtkMiterSat( pNtk, (ABC_INT64_T)(pParams->nMiteringLimitStart * pow(pParams->nMiteringLimitMulti,nIter)), (ABC_INT64_T)nInspectLimit, 0, &nSatConfs, &nSatInspects );
        Abc_NtkMiterPrint( pNtk, "SAT solving", clk, pParams->fVerbose );
        if ( RetValue >= 0 )
            break;

        // add to the number of backtracks and inspects
        pParams->nTotalBacktracksMade += nSatConfs;
        pParams->nTotalInspectsMade   += nSatInspects;
        // check if global resource limit is reached
        if ( (pParams->nTotalBacktrackLimit && pParams->nTotalBacktracksMade >= pParams->nTotalBacktrackLimit) ||
             (pParams->nTotalInspectLimit   && pParams->nTotalInspectsMade   >= pParams->nTotalInspectLimit) )
        {
            printf( "Reached global limit on conflicts/inspects. Quitting.\n" );
            *ppNtk = pNtk;
            return -1;
        }

        // try rewriting
        if ( pParams->fUseRewriting )
        {
            clk = Abc_Clock();
            Counter = (int)(pParams->nRewritingLimitStart * pow(pParams->nRewritingLimitMulti,nIter));
//            Counter = 1;
            while ( 1 )
            {
/*
                extern Abc_Ntk_t * Abc_NtkIvyResyn( Abc_Ntk_t * pNtk, int fUpdateLevel, int fVerbose );
                pNtk = Abc_NtkIvyResyn( pNtkTemp = pNtk, 0, 0 );  Abc_NtkDelete( pNtkTemp );
                if ( (RetValue = Abc_NtkMiterIsConstant(pNtk)) >= 0 )
                    break;
                if ( --Counter == 0 )
                    break;
*/
/*
                Abc_NtkRewrite( pNtk, 0, 0, 0, 0, 0 );
                if ( (RetValue = Abc_NtkMiterIsConstant(pNtk)) >= 0 )
                    break;
                if ( --Counter == 0 )
                    break;
*/
                Abc_NtkRewrite( pNtk, 0, 0, 0, 0, 0 );
                if ( (RetValue = Abc_NtkMiterIsConstant(pNtk)) >= 0 )
                    break;
                if ( --Counter == 0 )
                    break;
                Abc_NtkRefactor( pNtk, 10, 16, 0, 0, 0, 0 );
                if ( (RetValue = Abc_NtkMiterIsConstant(pNtk)) >= 0 )
                    break;
                if ( --Counter == 0 )
                    break;
                pNtk = Abc_NtkBalance( pNtkTemp = pNtk, 0, 0, 0 );  Abc_NtkDelete( pNtkTemp );
                if ( (RetValue = Abc_NtkMiterIsConstant(pNtk)) >= 0 )
                    break;
                if ( --Counter == 0 )
                    break;
            }
            Abc_NtkMiterPrint( pNtk, "Rewriting  ", clk, pParams->fVerbose );
        }
 
        if ( pParams->fUseFraiging )
        {
            // try FRAIGing
            clk = Abc_Clock();
            nInspectLimit = pParams->nTotalInspectLimit? pParams->nTotalInspectLimit - pParams->nTotalInspectsMade : 0;
            pNtk = Abc_NtkMiterFraig( pNtkTemp = pNtk, (int)(pParams->nFraigingLimitStart * pow(pParams->nFraigingLimitMulti,nIter)), nInspectLimit, &RetValue, &nSatFails, &nSatConfs, &nSatInspects );  Abc_NtkDelete( pNtkTemp );
            Abc_NtkMiterPrint( pNtk, "FRAIGing   ", clk, pParams->fVerbose );
//            printf( "NumFails = %d\n", nSatFails );
            if ( RetValue >= 0 )
                break;

            // add to the number of backtracks and inspects
            pParams->nTotalBacktracksMade += nSatConfs;
            pParams->nTotalInspectsMade += nSatInspects;
            // check if global resource limit is reached
            if ( (pParams->nTotalBacktrackLimit && pParams->nTotalBacktracksMade >= pParams->nTotalBacktrackLimit) ||
                 (pParams->nTotalInspectLimit   && pParams->nTotalInspectsMade   >= pParams->nTotalInspectLimit) )
            {
                printf( "Reached global limit on conflicts/inspects. Quitting.\n" );
                *ppNtk = pNtk;
                return -1;
            }
        }

    }    

    // try to prove it using brute force SAT
#ifdef ABC_USE_CUDD
    if ( RetValue < 0 && pParams->fUseBdds )
    {
        if ( pParams->fVerbose )
        {
            printf( "Attempting BDDs with node limit %d ...\n", pParams->nBddSizeLimit );
            fflush( stdout );
        }
        clk = Abc_Clock();
        pNtk = Abc_NtkCollapse( pNtkTemp = pNtk, pParams->nBddSizeLimit, 0, pParams->fBddReorder, 0, 0, 0 );
        if ( pNtk )   
        {
            Abc_NtkDelete( pNtkTemp );
            RetValue = ( (Abc_NtkNodeNum(pNtk) == 1) && (Abc_ObjFanin0(Abc_NtkPo(pNtk,0))->pData == Cudd_ReadLogicZero((DdManager *)pNtk->pManFunc)) );
        }
        else 
            pNtk = pNtkTemp;
        Abc_NtkMiterPrint( pNtk, "BDD building", clk, pParams->fVerbose );
    }
#endif

    if ( RetValue < 0 )
    {
        if ( pParams->fVerbose )
        {
            printf( "Attempting SAT with conflict limit %d ...\n", pParams->nMiteringLimitLast );
            fflush( stdout );
        }
        clk = Abc_Clock();
        nInspectLimit = pParams->nTotalInspectLimit? pParams->nTotalInspectLimit - pParams->nTotalInspectsMade : 0;
        RetValue = Abc_NtkMiterSat( pNtk, (ABC_INT64_T)pParams->nMiteringLimitLast, (ABC_INT64_T)nInspectLimit, 0, NULL, NULL );
        Abc_NtkMiterPrint( pNtk, "SAT solving", clk, pParams->fVerbose );
    }

    // assign the model if it was proved by rewriting (const 1 miter)
    if ( RetValue == 0 && pNtk->pModel == NULL )
    {
        pNtk->pModel = ABC_ALLOC( int, Abc_NtkCiNum(pNtk) );
        memset( pNtk->pModel, 0, sizeof(int) * Abc_NtkCiNum(pNtk) );
    }
    *ppNtk = pNtk;
    return RetValue;
}